

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<LineNumber>::emplace<LineNumber>
          (QPodArrayOps<LineNumber> *this,qsizetype i,LineNumber *args)

{
  long lVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  bool bVar4;
  qsizetype qVar5;
  LineNumber *pLVar6;
  qsizetype *in_RDX;
  QArrayDataPointer<LineNumber> *in_RSI;
  QArrayDataPointer<LineNumber> *in_RDI;
  long in_FS_OFFSET;
  LineNumber *where;
  GrowthPosition pos;
  bool detach;
  LineNumber tmp;
  QArrayDataPointer<LineNumber> *in_stack_ffffffffffffffb8;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QArrayDataPointer<LineNumber>::needsDetach(in_RDI);
  uVar8 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffc4);
  if (!bVar4) {
    if ((in_RSI == (QArrayDataPointer<LineNumber> *)in_RDI->size) &&
       (qVar5 = QArrayDataPointer<LineNumber>::freeSpaceAtEnd(in_stack_ffffffffffffffb8), qVar5 != 0
       )) {
      pLVar6 = QArrayDataPointer<LineNumber>::end(in_RDI);
      pLVar6->begin = *in_RDX;
      pLVar6->end = in_RDX[1];
      *(qsizetype *)&pLVar6->line = in_RDX[2];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121886;
    }
    if ((in_RSI == (QArrayDataPointer<LineNumber> *)0x0) &&
       (qVar5 = QArrayDataPointer<LineNumber>::freeSpaceAtBegin(in_stack_ffffffffffffffb8),
       qVar5 != 0)) {
      pLVar6 = QArrayDataPointer<LineNumber>::begin((QArrayDataPointer<LineNumber> *)0x121785);
      pLVar6[-1].begin = *in_RDX;
      pLVar6[-1].end = in_RDX[1];
      *(qsizetype *)&pLVar6[-1].line = in_RDX[2];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121886;
    }
  }
  qVar5 = *in_RDX;
  qVar2 = in_RDX[1];
  qVar3 = in_RDX[2];
  uVar7 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<LineNumber> *)0x0)) {
    uVar7 = 1;
  }
  QArrayDataPointer<LineNumber>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar8,uVar7),
             (LineNumber **)in_stack_ffffffffffffffb8,in_RDI);
  pLVar6 = createHole((QPodArrayOps<LineNumber> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar8,uVar7),(qsizetype)in_stack_ffffffffffffffb8);
  pLVar6->begin = qVar5;
  pLVar6->end = qVar2;
  *(qsizetype *)&pLVar6->line = qVar3;
LAB_00121886:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }